

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesH9
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,H9 *hasher,int *dist_cache,size_t *last_insert_len,
               Command *commands,size_t *num_commands,size_t *num_literals)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ushort uVar5;
  uint16_t uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int *piVar10;
  char *pcVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  size_t i;
  ulong uVar23;
  byte bVar24;
  ushort uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  bool bVar38;
  bool bVar39;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_100;
  ulong local_e8;
  ulong local_d8;
  ulong local_c8;
  ulong local_c0;
  Command *local_b8;
  
  uVar14 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar1 = position + num_bytes;
  uVar3 = (position - 3) + num_bytes;
  sVar15 = position;
  if (3 < num_bytes) {
    sVar15 = uVar3;
  }
  lVar16 = 0x200;
  if (params->quality < 9) {
    lVar16 = 0x40;
  }
  uVar4 = (position - 4) + num_bytes;
  lVar2 = position - 1;
  uVar37 = *last_insert_len;
  uVar22 = lVar16 + position;
  local_b8 = commands;
LAB_00107edf:
LAB_00107eed:
  uVar26 = position;
  if (uVar1 <= uVar26 + 4) {
    *last_insert_len = (uVar37 + uVar1) - uVar26;
    *num_commands = *num_commands + ((long)local_b8 - (long)commands >> 4);
    return;
  }
  local_c0 = uVar1 - uVar26;
  uVar19 = uVar14;
  if (uVar26 < uVar14) {
    uVar19 = uVar26;
  }
  uVar34 = uVar26 & ringbuffer_mask;
  piVar10 = (int *)(ringbuffer + uVar34);
  uVar18 = (ulong)((uint)local_c0 & 7);
  local_100 = 0;
  local_118 = 0x1f90;
  local_c8 = 0;
  uVar23 = 0;
  uVar32 = 0;
  bVar39 = false;
  do {
    if (uVar23 == 0x10) {
      uVar8 = (uint)(*piVar10 * 0x1e35a7bd) >> 0x11;
      lVar31 = (ulong)(uVar8 << 10) + 0x10000;
      uVar5 = hasher->num_[uVar8];
      uVar23 = (ulong)(uVar5 - 0x100);
      if (uVar5 < 0x101) {
        uVar23 = 0;
      }
      bVar39 = !bVar39;
      uVar27 = (ulong)uVar5;
      do {
        do {
          do {
            do {
              do {
                if (uVar27 <= uVar23) {
LAB_00108205:
                  *(int *)((long)hasher->buckets_ + ((ulong)uVar5 & 0xff) * 4 + lVar31 + -0x10000) =
                       (int)uVar26;
                  hasher->num_[uVar8] = uVar5 + 1;
                  if (!bVar39) {
                    local_e8 = 0;
                    goto LAB_00108544;
                  }
                  uVar32 = (hasher->dict_search_stats_).num_lookups;
                  local_130 = (hasher->dict_search_stats_).num_matches;
                  if (local_130 < uVar32 >> 7) goto LAB_00108444;
                  uVar18 = (ulong)(uVar8 & 0xfffffffe);
                  local_e8 = 0;
                  lVar31 = 0;
                  bVar39 = false;
                  goto LAB_0010827c;
                }
                uVar27 = uVar27 - 1;
                uVar33 = *(uint *)((long)hasher->buckets_ + (uVar27 & 0xff) * 4 + lVar31 + -0x10000)
                ;
                uVar17 = uVar26 - uVar33;
                if (uVar19 < uVar17) goto LAB_00108205;
              } while (ringbuffer_mask < uVar32 + uVar34);
              uVar28 = (ulong)(uVar33 & (uint)ringbuffer_mask);
            } while ((ringbuffer_mask < uVar28 + uVar32) ||
                    (ringbuffer[uVar32 + uVar34] != ringbuffer[uVar28 + uVar32]));
            uVar35 = 0;
            lVar30 = 0;
LAB_00108158:
            uVar12 = uVar18;
            uVar20 = local_c0 & 0xfffffffffffffff8;
            if (local_c0 >> 3 == uVar35) {
              for (; (uVar35 = local_c0, uVar12 != 0 &&
                     (uVar35 = uVar20,
                     ringbuffer[uVar20 + uVar28] == *(uint8_t *)((long)piVar10 + uVar20)));
                  uVar20 = uVar20 + 1) {
                uVar12 = uVar12 - 1;
              }
            }
            else {
              if (*(ulong *)(piVar10 + uVar35 * 2) == *(ulong *)(ringbuffer + uVar35 * 8 + uVar28))
              goto code_r0x00108171;
              uVar35 = *(ulong *)(ringbuffer + uVar35 * 8 + uVar28) ^
                       *(ulong *)(piVar10 + uVar35 * 2);
              uVar28 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar35 = (uVar28 >> 3 & 0x1fffffff) - lVar30;
            }
          } while (uVar35 < 4);
          iVar29 = 0x1f;
          if ((uint)uVar17 != 0) {
            for (; (uint)uVar17 >> iVar29 == 0; iVar29 = iVar29 + -1) {
            }
          }
          uVar28 = (ulong)(iVar29 * -0x78 + 0x1e00) + uVar35 * 0x21c;
        } while (uVar28 <= local_118);
        bVar39 = false;
        uVar32 = uVar35;
        local_118 = uVar28;
        local_100 = uVar17;
        local_c8 = uVar35;
      } while( true );
    }
    uVar27 = (long)kDistanceCacheOffset[uVar23] + (long)dist_cache[kDistanceCacheIndex[uVar23]];
    if (((uVar27 <= uVar19) && (uVar26 - uVar27 < uVar26)) && (uVar32 + uVar34 <= ringbuffer_mask))
    {
      uVar17 = uVar26 - uVar27 & ringbuffer_mask;
      if ((uVar17 + uVar32 <= ringbuffer_mask) &&
         (ringbuffer[uVar32 + uVar34] == ringbuffer[uVar17 + uVar32])) {
        uVar28 = 0;
        lVar31 = 0;
LAB_00107fe3:
        uVar35 = uVar18;
        uVar12 = local_c0 & 0xfffffffffffffff8;
        if (local_c0 >> 3 == uVar28) {
          for (; (uVar28 = local_c0, uVar35 != 0 &&
                 (uVar28 = uVar12,
                 ringbuffer[uVar12 + uVar17] == *(uint8_t *)((long)piVar10 + uVar12)));
              uVar12 = uVar12 + 1) {
            uVar35 = uVar35 - 1;
          }
        }
        else {
          if (*(ulong *)(piVar10 + uVar28 * 2) == *(ulong *)(ringbuffer + uVar28 * 8 + uVar17))
          goto code_r0x00108000;
          uVar28 = *(ulong *)(ringbuffer + uVar28 * 8 + uVar17) ^ *(ulong *)(piVar10 + uVar28 * 2);
          uVar17 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          uVar28 = (uVar17 >> 3 & 0x1fffffff) - lVar31;
        }
        if (((2 < uVar28) || ((uVar23 < 2 && (uVar28 == 2)))) &&
           (uVar17 = uVar28 * 0x21c + kDistanceShortCodeCost[uVar23], local_118 < uVar17)) {
          bVar39 = true;
          uVar32 = uVar28;
          local_118 = uVar17;
          local_100 = uVar27;
          local_c8 = uVar28;
        }
      }
    }
    uVar23 = uVar23 + 1;
  } while( true );
LAB_0010827c:
  if (lVar31 == 2) goto LAB_00108439;
  uVar5 = kStaticDictionaryHash[uVar18];
  uVar32 = uVar32 + 1;
  (hasher->dict_search_stats_).num_lookups = uVar32;
  if (uVar5 != 0) {
    uVar23 = (ulong)(uVar5 & 0x1f);
    if (uVar23 <= local_c0) {
      lVar30 = uVar23 * (uVar5 >> 5) +
               (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength + uVar23 * 4);
      uVar34 = (ulong)(uVar5 & 0x18);
      uVar27 = 0;
LAB_00108310:
      if ((uVar5 & 0x18) == uVar27) {
        uVar17 = (ulong)(uVar5 & 7);
        pcVar11 = &kBrotliDictionary + uVar27 + lVar30;
        for (; (bVar38 = uVar17 != 0, uVar17 = uVar17 - 1, uVar27 = (ulong)(uVar5 & 0x1f), bVar38 &&
               (uVar27 = uVar34, *(char *)((long)piVar10 + uVar34) == *pcVar11));
            uVar34 = uVar34 + 1) {
          pcVar11 = pcVar11 + 1;
        }
      }
      else {
        uVar17 = *(ulong *)(&kBrotliDictionary + uVar27 + lVar30);
        if (uVar17 == *(ulong *)((long)piVar10 + uVar27)) goto code_r0x0010832b;
        uVar17 = *(ulong *)((long)piVar10 + uVar27) ^ uVar17;
        uVar34 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
          }
        }
        uVar27 = (uVar34 >> 3 & 0x1fffffff) + uVar27;
      }
      if ((uVar27 != 0) && (uVar23 < uVar27 + 10)) {
        uVar34 = (ulong)(uVar5 >> 5) + uVar19 + 1 +
                 ((ulong)""[uVar23 - uVar27] <<
                 ((&kBrotliDictionarySizeBitsByLength)[uVar23] & 0x3f));
        iVar29 = 0x1f;
        uVar8 = (uint)uVar34;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar29 == 0; iVar29 = iVar29 + -1) {
          }
        }
        uVar17 = (uVar27 * 0x21c - (ulong)(uint)(iVar29 * 0x78)) + 0x1e00;
        if (local_118 <= uVar17) {
          local_e8 = uVar23 ^ uVar27;
          local_130 = local_130 + 1;
          (hasher->dict_search_stats_).num_matches = local_130;
          bVar39 = true;
          local_118 = uVar17;
          local_100 = uVar34;
          local_c8 = uVar27;
        }
      }
    }
  }
  lVar31 = lVar31 + 1;
  uVar18 = uVar18 + 1;
  goto LAB_0010827c;
LAB_00108439:
  if (bVar39) goto LAB_00108544;
LAB_00108444:
  uVar37 = uVar37 + 1;
  position = uVar26 + 1;
  if (uVar22 < position) {
    if (uVar22 + (uint)((int)lVar16 * 4) < position) {
      uVar19 = uVar26 + 0x11;
      if (uVar4 <= uVar26 + 0x11) {
        uVar19 = uVar4;
      }
      for (; position < uVar19; position = position + 4) {
        uVar8 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar6 = hasher->num_[uVar8];
        *(int *)((long)hasher->buckets_ + (ulong)(uVar8 * 0x400 + (uint)(byte)uVar6 * 4)) =
             (int)position;
        hasher->num_[uVar8] = uVar6 + 1;
        uVar37 = uVar37 + 4;
      }
    }
    else {
      uVar19 = uVar26 + 9;
      if (uVar3 <= uVar26 + 9) {
        uVar19 = uVar3;
      }
      for (; position < uVar19; position = position + 2) {
        uVar8 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar6 = hasher->num_[uVar8];
        *(int *)((long)hasher->buckets_ + (ulong)(uVar8 * 0x400 + (uint)(byte)uVar6 * 4)) =
             (int)position;
        hasher->num_[uVar8] = uVar6 + 1;
        uVar37 = uVar37 + 2;
      }
    }
  }
  goto LAB_00107eed;
LAB_00108544:
  uVar22 = uVar37 + 4;
  uVar19 = (lVar2 + num_bytes) - uVar26;
  iVar29 = 0;
LAB_00108567:
  uVar18 = (ulong)((uint)uVar19 & 7);
  local_c0 = local_c0 - 1;
  uVar32 = local_c8 - 1;
  if (local_c0 <= local_c8 - 1) {
    uVar32 = local_c0;
  }
  if (4 < params->quality) {
    uVar32 = 0;
  }
  uVar23 = uVar26 + 1;
  uVar34 = uVar14;
  if (uVar23 < uVar14) {
    uVar34 = uVar23;
  }
  uVar17 = uVar23 & ringbuffer_mask;
  piVar10 = (int *)(ringbuffer + uVar17);
  local_128 = 0x1f90;
  local_110 = 0;
  uVar27 = 0;
  uVar28 = 0;
  bVar39 = false;
  do {
    if (uVar28 == 0x10) {
      uVar8 = (uint)(*piVar10 * 0x1e35a7bd) >> 0x11;
      lVar31 = (ulong)(uVar8 << 10) + 0x10000;
      uVar5 = hasher->num_[uVar8];
      uVar28 = (ulong)(uVar5 - 0x100);
      if (uVar5 < 0x101) {
        uVar28 = 0;
      }
      bVar39 = !bVar39;
      uVar35 = (ulong)uVar5;
      do {
        do {
          do {
            do {
              do {
                if (uVar35 <= uVar28) {
LAB_0010889a:
                  *(int *)((long)hasher->buckets_ + ((ulong)uVar5 & 0xff) * 4 + lVar31 + -0x10000) =
                       (int)uVar23;
                  hasher->num_[uVar8] = uVar5 + 1;
                  uVar32 = uVar26;
                  uVar18 = uVar37;
                  if (!bVar39) {
                    local_120 = 0;
                    goto LAB_00108b25;
                  }
                  uVar17 = (hasher->dict_search_stats_).num_lookups;
                  local_d8 = (hasher->dict_search_stats_).num_matches;
                  if (local_d8 < uVar17 >> 7) goto LAB_00108bc1;
                  uVar28 = (ulong)(uVar8 & 0xfffffffe);
                  local_120 = 0;
                  lVar31 = 0;
                  bVar39 = false;
                  goto LAB_0010891c;
                }
                uVar35 = uVar35 - 1;
                uVar33 = *(uint *)((long)hasher->buckets_ + (uVar35 & 0xff) * 4 + lVar31 + -0x10000)
                ;
                uVar12 = uVar23 - uVar33;
                if (uVar34 < uVar12) goto LAB_0010889a;
              } while (ringbuffer_mask < uVar32 + uVar17);
              uVar20 = (ulong)(uVar33 & (uint)ringbuffer_mask);
            } while ((ringbuffer_mask < uVar20 + uVar32) ||
                    (ringbuffer[uVar32 + uVar17] != ringbuffer[uVar20 + uVar32]));
            uVar21 = 0;
            lVar30 = 0;
LAB_001087ed:
            if (uVar19 >> 3 == uVar21) {
              uVar36 = uVar18;
              for (uVar21 = -lVar30;
                  (bVar38 = uVar36 != 0, uVar36 = uVar36 - 1, bVar38 &&
                  (ringbuffer[uVar21 + uVar20] == *(uint8_t *)((long)piVar10 + uVar21)));
                  uVar21 = uVar21 + 1) {
              }
            }
            else {
              if (*(ulong *)(piVar10 + uVar21 * 2) == *(ulong *)(ringbuffer + uVar21 * 8 + uVar20))
              goto code_r0x00108806;
              uVar21 = *(ulong *)(ringbuffer + uVar21 * 8 + uVar20) ^
                       *(ulong *)(piVar10 + uVar21 * 2);
              uVar20 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar21 = (uVar20 >> 3 & 0x1fffffff) - lVar30;
            }
          } while (uVar21 < 4);
          iVar7 = 0x1f;
          if ((uint)uVar12 != 0) {
            for (; (uint)uVar12 >> iVar7 == 0; iVar7 = iVar7 + -1) {
            }
          }
          uVar20 = (ulong)(iVar7 * -0x78 + 0x1e00) + uVar21 * 0x21c;
        } while (uVar20 <= local_128);
        bVar39 = false;
        uVar27 = uVar21;
        uVar32 = uVar21;
        local_128 = uVar20;
        local_110 = uVar12;
      } while( true );
    }
    uVar35 = (long)kDistanceCacheOffset[uVar28] + (long)dist_cache[kDistanceCacheIndex[uVar28]];
    if (((uVar35 <= uVar34) && (uVar23 - uVar35 < uVar23)) && (uVar17 + uVar32 <= ringbuffer_mask))
    {
      uVar12 = uVar23 - uVar35 & ringbuffer_mask;
      if ((uVar12 + uVar32 <= ringbuffer_mask) &&
         (ringbuffer[uVar17 + uVar32] == ringbuffer[uVar12 + uVar32])) {
        uVar20 = 0;
        lVar31 = 0;
LAB_0010866b:
        if (uVar19 >> 3 == uVar20) {
          uVar21 = uVar18;
          for (uVar20 = -lVar31;
              (bVar38 = uVar21 != 0, uVar21 = uVar21 - 1, bVar38 &&
              (ringbuffer[uVar20 + uVar12] == *(uint8_t *)((long)piVar10 + uVar20)));
              uVar20 = uVar20 + 1) {
          }
        }
        else {
          if (*(ulong *)(piVar10 + uVar20 * 2) == *(ulong *)(ringbuffer + uVar20 * 8 + uVar12))
          goto code_r0x0010868b;
          uVar20 = *(ulong *)(ringbuffer + uVar20 * 8 + uVar12) ^ *(ulong *)(piVar10 + uVar20 * 2);
          uVar12 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
          uVar20 = (uVar12 >> 3 & 0x1fffffff) - lVar31;
        }
        if (((2 < uVar20) || ((uVar28 < 2 && (uVar20 == 2)))) &&
           (uVar12 = uVar20 * 0x21c + kDistanceShortCodeCost[uVar28], local_128 < uVar12)) {
          bVar39 = true;
          local_110 = uVar35;
          uVar27 = uVar20;
          uVar32 = uVar20;
          local_128 = uVar12;
        }
      }
    }
    uVar28 = uVar28 + 1;
  } while( true );
LAB_0010891c:
  if (lVar31 == 2) goto LAB_00108b12;
  uVar5 = kStaticDictionaryHash[uVar28];
  uVar17 = uVar17 + 1;
  (hasher->dict_search_stats_).num_lookups = uVar17;
  if (uVar5 != 0) {
    uVar35 = (ulong)(uVar5 & 0x1f);
    if (uVar35 <= local_c0) {
      lVar30 = uVar35 * (uVar5 >> 5) +
               (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength + uVar35 * 4);
      uVar12 = (ulong)(uVar5 & 0x18);
      uVar20 = 0;
LAB_0010899e:
      if ((uVar5 & 0x18) == uVar20) {
        uVar21 = (ulong)(uVar5 & 7);
        pcVar11 = &kBrotliDictionary + uVar20 + lVar30;
        for (; (bVar38 = uVar21 != 0, uVar21 = uVar21 - 1, uVar20 = (ulong)(uVar5 & 0x1f), bVar38 &&
               (uVar20 = uVar12, *(char *)((long)piVar10 + uVar12) == *pcVar11));
            uVar12 = uVar12 + 1) {
          pcVar11 = pcVar11 + 1;
        }
      }
      else {
        uVar21 = *(ulong *)(&kBrotliDictionary + uVar20 + lVar30);
        if (uVar21 == *(ulong *)((long)piVar10 + uVar20)) goto code_r0x001089ba;
        uVar21 = *(ulong *)((long)piVar10 + uVar20) ^ uVar21;
        uVar12 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        uVar20 = (uVar12 >> 3 & 0x1fffffff) + uVar20;
      }
      if ((uVar20 != 0) && (uVar35 < uVar20 + 10)) {
        uVar12 = (ulong)(uVar5 >> 5) + uVar34 + 1 +
                 ((ulong)""[uVar35 - uVar20] <<
                 ((&kBrotliDictionarySizeBitsByLength)[uVar35] & 0x3f));
        iVar7 = 0x1f;
        uVar8 = (uint)uVar12;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        uVar21 = (uVar20 * 0x21c - (ulong)(uint)(iVar7 * 0x78)) + 0x1e00;
        if (local_128 <= uVar21) {
          local_120 = uVar35 ^ uVar20;
          local_d8 = local_d8 + 1;
          (hasher->dict_search_stats_).num_matches = local_d8;
          bVar39 = true;
          local_128 = uVar21;
          local_110 = uVar12;
          uVar27 = uVar20;
        }
      }
    }
  }
  lVar31 = lVar31 + 1;
  uVar28 = uVar28 + 1;
  goto LAB_0010891c;
LAB_00108b12:
  if (!bVar39) goto LAB_00108bc1;
LAB_00108b25:
  uVar34 = local_118 + 700;
  local_118 = local_128;
  if ((local_128 < uVar34) ||
     (local_100 = local_110, local_c8 = uVar27, uVar32 = uVar23, local_e8 = local_120,
     uVar18 = uVar22, iVar29 == 3)) goto LAB_00108bc1;
  uVar37 = uVar37 + 1;
  iVar29 = iVar29 + 1;
  uVar34 = uVar26 + 5;
  uVar19 = uVar19 - 1;
  uVar26 = uVar23;
  uVar18 = uVar37;
  if (uVar1 <= uVar34) goto LAB_00108bc1;
  goto LAB_00108567;
code_r0x001089ba:
  uVar20 = uVar20 + 8;
  goto LAB_0010899e;
LAB_00108bc1:
  uVar22 = uVar14;
  if (uVar32 < uVar14) {
    uVar22 = uVar32;
  }
  if (uVar22 < local_100) {
LAB_00108bd7:
    uVar37 = local_100 + 0xf;
  }
  else {
    if (local_100 == (long)*dist_cache) {
      uVar37 = 0;
      goto LAB_00108c0b;
    }
    uVar37 = 1;
    if (local_100 != (long)dist_cache[1]) {
      uVar37 = (local_100 + 3) - (long)*dist_cache;
      if (uVar37 < 7) {
        bVar24 = (byte)((int)uVar37 << 2);
        uVar8 = 0x9750468;
      }
      else {
        uVar37 = (local_100 + 3) - (long)dist_cache[1];
        if (6 < uVar37) {
          uVar37 = 2;
          if ((local_100 != (long)dist_cache[2]) && (uVar37 = 3, local_100 != (long)dist_cache[3]))
          goto LAB_00108bd7;
          goto LAB_00108bdb;
        }
        bVar24 = (byte)((int)uVar37 << 2);
        uVar8 = 0xfdb1ace;
      }
      uVar37 = (ulong)(uVar8 >> (bVar24 & 0x1f) & 0xf);
    }
  }
LAB_00108bdb:
  if ((local_100 <= uVar22) && (uVar37 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)local_100;
  }
LAB_00108c0b:
  uVar8 = (uint)uVar18;
  local_b8->insert_len_ = uVar8;
  local_b8->copy_len_ = (uint)local_c8 | (int)local_e8 << 0x18;
  if (uVar37 < 0x10) {
    uVar13 = 0;
  }
  else {
    uVar33 = 0x1f;
    uVar13 = (uint)(uVar37 - 0xc);
    if (uVar13 != 0) {
      for (; uVar13 >> uVar33 == 0; uVar33 = uVar33 - 1) {
      }
    }
    uVar9 = (uVar33 ^ 0xffffffe0) + 0x1f;
    bVar39 = (uVar37 - 0xc >> ((ulong)uVar9 & 0x3f) & 1) != 0;
    uVar13 = uVar13 - (bVar39 + 2 << ((byte)uVar9 & 0x3f)) | uVar9 * 0x1000000;
    uVar37 = (ulong)((uint)bVar39 + (uVar33 ^ 0xffffffe0) * 2 + 0x4c);
  }
  local_b8->dist_prefix_ = (uint16_t)uVar37;
  local_b8->dist_extra_ = uVar13;
  if (5 < uVar18) {
    if (uVar18 < 0x82) {
      uVar8 = 0x1f;
      uVar33 = (uint)(uVar18 - 2);
      if (uVar33 != 0) {
        for (; uVar33 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = (int)(uVar18 - 2 >> ((char)(uVar8 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
              (uVar8 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar18 < 0x842) {
      uVar33 = 0x1f;
      if (uVar8 - 0x42 != 0) {
        for (; uVar8 - 0x42 >> uVar33 == 0; uVar33 = uVar33 - 1) {
        }
      }
      uVar8 = (uVar33 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar8 = 0x15;
      if (0x1841 < uVar18) {
        uVar8 = (uint)(ushort)(0x17 - (uVar18 < 0x5842));
      }
    }
  }
  local_e8 = local_e8 ^ local_c8;
  if (local_e8 < 10) {
    uVar33 = (int)local_e8 - 2;
  }
  else if (local_e8 < 0x86) {
    uVar33 = 0x1f;
    uVar13 = (uint)(local_e8 - 6);
    if (uVar13 != 0) {
      for (; uVar13 >> uVar33 == 0; uVar33 = uVar33 - 1) {
      }
    }
    uVar33 = (int)(local_e8 - 6 >> ((char)(uVar33 ^ 0xffffffe0) + 0x1fU & 0x3f)) + 0x42 +
             (uVar33 ^ 0xffffffe0) * 2;
  }
  else {
    uVar33 = 0x17;
    if (local_e8 < 0x846) {
      uVar13 = (int)local_e8 - 0x46;
      uVar33 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> uVar33 == 0; uVar33 = uVar33 - 1) {
        }
      }
      uVar33 = (uVar33 ^ 0xffe0) + 0x2c;
    }
  }
  uVar5 = (ushort)uVar33;
  uVar25 = (uVar5 & 7) + ((ushort)uVar8 & 7) * 8;
  if ((((uint16_t)uVar37 == 0) && ((ushort)uVar8 < 8)) && (uVar5 < 0x10)) {
    if (7 < uVar5) {
      uVar25 = uVar25 | 0x40;
    }
  }
  else {
    uVar25 = uVar25 | *(ushort *)
                       (CombineLengthCodes_cells +
                       (ulong)(((uVar8 & 0xffff) >> 3) * 3 + ((uVar33 & 0xffff) >> 3)) * 2);
  }
  local_b8->cmd_prefix_ = uVar25;
  *num_literals = *num_literals + uVar18;
  uVar22 = lVar16 + uVar32 + local_c8 * 2;
  local_b8 = local_b8 + 1;
  position = local_c8 + uVar32;
  uVar32 = uVar32 + 2;
  uVar37 = sVar15;
  if (position < sVar15) {
    uVar37 = position;
  }
  for (; uVar32 < uVar37; uVar32 = uVar32 + 1) {
    uVar8 = (uint)(*(int *)(ringbuffer + (uVar32 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar6 = hasher->num_[uVar8];
    *(int *)((long)hasher->buckets_ + (ulong)(uVar8 * 0x400 + (uint)(byte)uVar6 * 4)) = (int)uVar32;
    hasher->num_[uVar8] = uVar6 + 1;
  }
  uVar37 = 0;
  goto LAB_00107edf;
code_r0x00108806:
  lVar30 = lVar30 + -8;
  uVar21 = uVar21 + 1;
  goto LAB_001087ed;
code_r0x0010868b:
  lVar31 = lVar31 + -8;
  uVar20 = uVar20 + 1;
  goto LAB_0010866b;
code_r0x0010832b:
  uVar27 = uVar27 + 8;
  goto LAB_00108310;
code_r0x00108171:
  lVar30 = lVar30 + -8;
  uVar35 = uVar35 + 1;
  goto LAB_00108158;
code_r0x00108000:
  lVar31 = lVar31 + -8;
  uVar28 = uVar28 + 1;
  goto LAB_00107fe3;
}

Assistant:

static BROTLI_NOINLINE void FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, Hasher* hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 400;

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_x_code = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    if (FN(FindLongestMatch)(hasher, ringbuffer, ringbuffer_mask, dist_cache,
                             position, max_length, max_distance, &sr)) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 700;
        BROTLI_BOOL is_match_found;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_x_code = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        is_match_found = FN(FindLongestMatch)(hasher, ringbuffer,
            ringbuffer_mask, dist_cache, position + 1, max_length, max_distance,
            &sr2);
        if (is_match_found && sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance, dist_cache);
        if (sr.distance <= max_distance && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
        }
        InitCommand(commands++, insert_length, sr.len, sr.len ^ sr.len_x_code,
            distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them. */
      FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, position + 2,
                     BROTLI_MIN(size_t, position + sr.len, store_end));
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}